

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_WriteBinaryFile::test_method(util_WriteBinaryFile *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  bool valid;
  ifstream file;
  string actual_text;
  string expected_text;
  path tmpfile;
  path tmpfolder;
  char *in_stack_fffffffffffffbe8;
  ArgsManager *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  lazy_ostream *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc18;
  size_t line_num;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  lazy_ostream *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  undefined1 local_398 [16];
  undefined1 local_388 [64];
  const_string local_348 [2];
  lazy_ostream local_328 [2];
  allocator<char> local_2c9;
  istream local_2c8 [72];
  string local_c0 [32];
  _Base_ptr local_8;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffffbf0);
  fs::path::path((path *)in_stack_fffffffffffffbe8,(path *)0xc8dcb1);
  fs::operator/((path *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  fs::path::~path((path *)in_stack_fffffffffffffbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38),in_stack_fffffffffffffc30
             ,(allocator<char> *)in_stack_fffffffffffffc28);
  std::allocator<char>::~allocator(&local_2c9);
  WriteBinaryFile((path *)in_stack_fffffffffffffc10,
                  (string *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  std::__cxx11::string::string(in_stack_fffffffffffffc00);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbf8,
             (path *)in_stack_fffffffffffffbf0,(openmode)((ulong)in_stack_fffffffffffffbe8 >> 0x20))
  ;
  std::operator>>(local_2c8,local_c0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8,
               (pointer)in_stack_fffffffffffffbf0,(unsigned_long)in_stack_fffffffffffffbe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc28,
               (const_string *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,(const_string *)in_stack_fffffffffffffc10);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffbf8,
               SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0));
    in_stack_fffffffffffffc28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8,
               (pointer)in_stack_fffffffffffffbf0,(unsigned_long)in_stack_fffffffffffffbe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbf0,
               (basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8,
               (pointer)in_stack_fffffffffffffbf0,(unsigned_long)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffbe8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffcf8,local_328,local_348,0x70f,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffbe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffc27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc27);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8,
               (pointer)in_stack_fffffffffffffbf0,(unsigned_long)in_stack_fffffffffffffbe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc28,
               (const_string *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               line_num,(const_string *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc10 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffbf0,(char (*) [1])in_stack_fffffffffffffbe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffbf8,
               (pointer)in_stack_fffffffffffffbf0,(unsigned_long)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffbf8 = "expected_text";
    in_stack_fffffffffffffbf0 = (ArgsManager *)&stack0xffffffffffffff60;
    in_stack_fffffffffffffbe8 = "actual_text";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_388,local_398,0x710,1,2,local_c0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffbe8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::ifstream::~ifstream(local_2c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe8);
  fs::path::~path((path *)in_stack_fffffffffffffbe8);
  fs::path::~path((path *)in_stack_fffffffffffffbe8);
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_WriteBinaryFile)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    fs::path tmpfile = tmpfolder / "write_binary.dat";
    std::string expected_text = "bitcoin";
    auto valid = WriteBinaryFile(tmpfile, expected_text);
    std::string actual_text;
    std::ifstream file{tmpfile};
    file >> actual_text;
    BOOST_CHECK(valid);
    BOOST_CHECK_EQUAL(actual_text, expected_text);
}